

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O1

void __thiscall
num_parse_test_parse_signed_Test::~num_parse_test_parse_signed_Test
          (num_parse_test_parse_signed_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(num_parse_test, parse_signed) {
  int32_t expected32 = 32;
  auto res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&expected32));
  EXPECT_EQ(res32, expected32);

  int32_t nexpected32 = -64;
  auto nres32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&nexpected32));
  EXPECT_EQ(nres32, nexpected32);
}